

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_cluster_server_handler(cluster_pr_s *pr)

{
  size_t sVar1;
  char *pcVar2;
  fio_str_s key;
  fio_str_s key_00;
  fio_str_s key_01;
  subscribe_args_s args;
  undefined1 auVar3 [64];
  subscribe_args_s args_00;
  undefined1 auVar5 [48];
  subscription_s *psVar6;
  uint64_t uVar7;
  fio_msg_internal_s *pfVar8;
  void *in_stack_fffffffffffffe60;
  fio_sub_hash_s *set;
  undefined2 uStack_172;
  fio_str_s tmp_3;
  fio_str_s tmp_2;
  subscription_s *s_1;
  uintptr_t match;
  fio_str_s tmp_1;
  fio_str_s tmp;
  subscription_s *s;
  cluster_pr_s *pr_local;
  undefined1 auVar4 [24];
  
  switch(pr->type) {
  case 0:
  case 1:
    pfVar8 = fio_msg_internal_dup(pr->msg);
    fio_cluster_server_sender(pfVar8,pr->uuid);
    pfVar8 = fio_msg_internal_dup(pr->msg);
    fio_publish2process(pfVar8);
    break;
  case 3:
    pr->type = 1;
  case 2:
    pfVar8 = fio_msg_internal_dup(pr->msg);
    fio_publish2process(pfVar8);
    break;
  case 4:
    auVar3 = ZEXT4064(CONCAT832(fio_mock_on_message,CONCAT824(0,pr->msg->channel)));
    args.udata2 = in_stack_fffffffffffffe60;
    auVar4 = auVar3._8_24_;
    args.filter = auVar3._0_4_;
    args._4_4_ = auVar3._4_4_;
    args.channel.capa = auVar4._0_8_;
    args.channel.len = auVar4._8_8_;
    args.channel.data = (char *)auVar4._16_8_;
    args.match = (fio_match_fn)auVar3._32_8_;
    args.on_message = (_func_void_fio_msg_s_ptr *)auVar3._40_8_;
    args.on_unsubscribe = (_func_void_void_ptr_void_ptr *)auVar3._48_8_;
    args.udata1 = (void *)auVar3._56_8_;
    psVar6 = fio_subscribe(args);
    tmp_1.data._0_4_ = 0;
    tmp_1.data._4_1_ = 0;
    tmp_1.data._5_1_ = 0;
    memset((void *)((long)&tmp_1.data + 6),0,10);
    sVar1 = (pr->msg->channel).len;
    pcVar2 = (pr->msg->channel).data;
    fio_lock(&pr->lock);
    uVar7 = fio_siphash13((pr->msg->channel).data,(pr->msg->channel).len,0x1bac58,0x1bac58);
    key.small = tmp_1.data._4_1_;
    key.ref = tmp_1.data._0_4_;
    key.frozen = tmp_1.data._5_1_;
    key.reserved[0] = tmp_1.data._6_1_;
    key.reserved[1] = tmp_1.data._7_1_;
    key.reserved._2_8_ = tmp._0_8_;
    key.capa = 0;
    key.len = sVar1;
    key.dealloc = fio_free;
    key.data = pcVar2;
    fio_sub_hash_insert(&pr->pubsub,uVar7,key,psVar6,(subscription_s **)0x0);
    fio_unlock(&pr->lock);
    break;
  case 5:
    match._0_4_ = 0;
    match._4_1_ = 0;
    match._5_1_ = 0;
    memset((void *)((long)&match + 6),0,10);
    tmp_1.reserved[2] = '\0';
    tmp_1.reserved[3] = '\0';
    tmp_1.reserved[4] = '\0';
    tmp_1.reserved[5] = '\0';
    tmp_1.reserved[6] = '\0';
    tmp_1.reserved[7] = '\0';
    tmp_1.reserved[8] = '\0';
    tmp_1.reserved[9] = '\0';
    tmp_1.capa = (pr->msg->channel).len;
    tmp_1.len = (uint64_t)fio_free;
    tmp_1.dealloc = (_func_void_void_ptr *)(pr->msg->channel).data;
    fio_lock(&pr->lock);
    uVar7 = fio_siphash13((pr->msg->channel).data,(pr->msg->channel).len,0x1bac58,0x1bac58);
    key_00.small = match._4_1_;
    key_00.ref = (undefined4)match;
    key_00.frozen = match._5_1_;
    key_00.reserved[0] = match._6_1_;
    key_00.reserved[1] = match._7_1_;
    key_00.reserved._2_8_ = tmp_1._0_8_;
    key_00.capa._0_1_ = tmp_1.reserved[2];
    key_00.capa._1_1_ = tmp_1.reserved[3];
    key_00.capa._2_1_ = tmp_1.reserved[4];
    key_00.capa._3_1_ = tmp_1.reserved[5];
    key_00.capa._4_1_ = tmp_1.reserved[6];
    key_00.capa._5_1_ = tmp_1.reserved[7];
    key_00.capa._6_1_ = tmp_1.reserved[8];
    key_00.capa._7_1_ = tmp_1.reserved[9];
    key_00.len = tmp_1.capa;
    key_00.dealloc = (_func_void_void_ptr *)tmp_1.len;
    key_00.data = (char *)tmp_1.dealloc;
    fio_sub_hash_remove(&pr->pubsub,uVar7,key_00,(subscription_s **)0x0);
    fio_unlock(&pr->lock);
    break;
  case 6:
    auVar3 = ZEXT4064(CONCAT832(fio_mock_on_message,
                                CONCAT824((ulong)(byte)*(pr->msg->data).data << 0x38 |
                                          (ulong)(byte)(pr->msg->data).data[1] << 0x30 |
                                          (ulong)(byte)(pr->msg->data).data[2] << 0x28 |
                                          (ulong)(byte)(pr->msg->data).data[3] << 0x20 |
                                          (ulong)(byte)(pr->msg->data).data[4] << 0x18 |
                                          (ulong)(byte)(pr->msg->data).data[5] << 0x10 |
                                          (ulong)(byte)(pr->msg->data).data[6] << 8 |
                                          (ulong)(byte)(pr->msg->data).data[7],pr->msg->channel)));
    args_00.udata2 = in_stack_fffffffffffffe60;
    auVar4 = auVar3._8_24_;
    args_00.filter = auVar3._0_4_;
    args_00._4_4_ = auVar3._4_4_;
    args_00.channel.capa = auVar4._0_8_;
    args_00.channel.len = auVar4._8_8_;
    args_00.channel.data = (char *)auVar4._16_8_;
    args_00.match = (fio_match_fn)auVar3._32_8_;
    args_00.on_message = (_func_void_fio_msg_s_ptr *)auVar3._40_8_;
    args_00.on_unsubscribe = (_func_void_void_ptr_void_ptr *)auVar3._48_8_;
    args_00.udata1 = (void *)auVar3._56_8_;
    psVar6 = fio_subscribe(args_00);
    tmp_3.data._0_4_ = 0;
    tmp_3.data._4_1_ = 0;
    tmp_3.data._5_1_ = 0;
    memset((void *)((long)&tmp_3.data + 6),0,10);
    sVar1 = (pr->msg->channel).len;
    pcVar2 = (pr->msg->channel).data;
    fio_lock(&pr->lock);
    uVar7 = fio_siphash13((pr->msg->channel).data,(pr->msg->channel).len,0x1bac58,0x1bac58);
    key_01.small = tmp_3.data._4_1_;
    key_01.ref = tmp_3.data._0_4_;
    key_01.frozen = tmp_3.data._5_1_;
    key_01.reserved[0] = tmp_3.data._6_1_;
    key_01.reserved[1] = tmp_3.data._7_1_;
    key_01.reserved._2_8_ = tmp_2._0_8_;
    key_01.capa = 0;
    key_01.len = sVar1;
    key_01.dealloc = fio_free;
    key_01.data = pcVar2;
    fio_sub_hash_insert(&pr->patterns,uVar7,key_01,psVar6,(subscription_s **)0x0);
    fio_unlock(&pr->lock);
    break;
  case 7:
    memset(&uStack_172,0,10);
    tmp_3.reserved[2] = '\0';
    tmp_3.reserved[3] = '\0';
    tmp_3.reserved[4] = '\0';
    tmp_3.reserved[5] = '\0';
    tmp_3.reserved[6] = '\0';
    tmp_3.reserved[7] = '\0';
    tmp_3.reserved[8] = '\0';
    tmp_3.reserved[9] = '\0';
    tmp_3.capa = (pr->msg->channel).len;
    tmp_3.len = (uint64_t)fio_free;
    tmp_3.dealloc = (_func_void_void_ptr *)(pr->msg->channel).data;
    fio_lock(&pr->lock);
    set = &pr->patterns;
    uVar7 = fio_siphash13((pr->msg->channel).data,(pr->msg->channel).len,0x1bac58,0x1bac58);
    auVar5._2_4_ = tmp_3.ref;
    auVar5[6] = tmp_3.small;
    auVar5[7] = tmp_3.frozen;
    auVar5[8] = tmp_3.reserved[0];
    auVar5[9] = tmp_3.reserved[1];
    auVar5._0_2_ = uStack_172;
    auVar5[10] = tmp_3.reserved[2];
    auVar5[0xb] = tmp_3.reserved[3];
    auVar5[0xc] = tmp_3.reserved[4];
    auVar5[0xd] = tmp_3.reserved[5];
    auVar5[0xe] = tmp_3.reserved[6];
    auVar5[0xf] = tmp_3.reserved[7];
    auVar5[0x10] = tmp_3.reserved[8];
    auVar5[0x11] = tmp_3.reserved[9];
    auVar5._18_8_ = tmp_3.capa;
    auVar5._26_8_ = tmp_3.len;
    auVar5._34_8_ = tmp_3.dealloc;
    auVar5._42_6_ = 0;
    fio_sub_hash_remove(set,uVar7,(fio_str_s)(auVar5 << 0x30),(subscription_s **)0x0);
    fio_unlock(&pr->lock);
    break;
  case 8:
  case 9:
  case 10:
  }
  return;
}

Assistant:

static void fio_cluster_server_handler(struct cluster_pr_s *pr) {
  /* what to do? */
  // fprintf(stderr, "-");
  switch ((fio_cluster_message_type_e)pr->type) {

  case FIO_CLUSTER_MSG_FORWARD: /* fallthrough */
  case FIO_CLUSTER_MSG_JSON: {
    fio_cluster_server_sender(fio_msg_internal_dup(pr->msg), pr->uuid);
    fio_publish2process(fio_msg_internal_dup(pr->msg));
    break;
  }

  case FIO_CLUSTER_MSG_PUBSUB_SUB: {
    subscription_s *s =
        fio_subscribe(.on_message = fio_mock_on_message, .match = NULL,
                      .channel = pr->msg->channel);
    fio_str_s tmp = FIO_STR_INIT_EXISTING(
        pr->msg->channel.data, pr->msg->channel.len, 0); // don't free
    fio_lock(&pr->lock);
    fio_sub_hash_insert(&pr->pubsub,
                        FIO_HASH_FN(pr->msg->channel.data, pr->msg->channel.len,
                                    &fio_postoffice.pubsub,
                                    &fio_postoffice.pubsub),
                        tmp, s, NULL);
    fio_unlock(&pr->lock);
    break;
  }
  case FIO_CLUSTER_MSG_PUBSUB_UNSUB: {
    fio_str_s tmp = FIO_STR_INIT_EXISTING(
        pr->msg->channel.data, pr->msg->channel.len, 0); // don't free
    fio_lock(&pr->lock);
    fio_sub_hash_remove(&pr->pubsub,
                        FIO_HASH_FN(pr->msg->channel.data, pr->msg->channel.len,
                                    &fio_postoffice.pubsub,
                                    &fio_postoffice.pubsub),
                        tmp, NULL);
    fio_unlock(&pr->lock);
    break;
  }

  case FIO_CLUSTER_MSG_PATTERN_SUB: {
    uintptr_t match = fio_str2u64(pr->msg->data.data);
    subscription_s *s = fio_subscribe(.on_message = fio_mock_on_message,
                                      .match = (fio_match_fn)match,
                                      .channel = pr->msg->channel);
    fio_str_s tmp = FIO_STR_INIT_EXISTING(
        pr->msg->channel.data, pr->msg->channel.len, 0); // don't free
    fio_lock(&pr->lock);
    fio_sub_hash_insert(&pr->patterns,
                        FIO_HASH_FN(pr->msg->channel.data, pr->msg->channel.len,
                                    &fio_postoffice.pubsub,
                                    &fio_postoffice.pubsub),
                        tmp, s, NULL);
    fio_unlock(&pr->lock);
    break;
  }

  case FIO_CLUSTER_MSG_PATTERN_UNSUB: {
    fio_str_s tmp = FIO_STR_INIT_EXISTING(
        pr->msg->channel.data, pr->msg->channel.len, 0); // don't free
    fio_lock(&pr->lock);
    fio_sub_hash_remove(&pr->patterns,
                        FIO_HASH_FN(pr->msg->channel.data, pr->msg->channel.len,
                                    &fio_postoffice.pubsub,
                                    &fio_postoffice.pubsub),
                        tmp, NULL);
    fio_unlock(&pr->lock);
    break;
  }

  case FIO_CLUSTER_MSG_ROOT_JSON:
    pr->type = FIO_CLUSTER_MSG_JSON; /* fallthrough */
  case FIO_CLUSTER_MSG_ROOT:
    fio_publish2process(fio_msg_internal_dup(pr->msg));
    break;

  case FIO_CLUSTER_MSG_SHUTDOWN: /* fallthrough */
  case FIO_CLUSTER_MSG_ERROR:    /* fallthrough */
  case FIO_CLUSTER_MSG_PING:     /* fallthrough */
  default:
    break;
  }
}